

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_MBCSOpen(UConverter *cnv,UConverterLoadArgs *pArgs,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  uint8_t uVar2;
  UConverterSharedData *pUVar3;
  int32_t *piVar4;
  UConverterSharedData *pUVar5;
  ushort *puVar6;
  uint8_t *__src;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  int32_t (*paiVar11) [256];
  ulong uVar12;
  size_t sVar13;
  char cVar14;
  int32_t (*__dest) [256];
  
  if (pArgs->onlyTestIsLoadable != '\0') {
    return;
  }
  pUVar3 = cnv->sharedData;
  uVar1 = (pUVar3->mbcs).outputType;
  uVar7 = pArgs->options;
  if (uVar1 == 0xdb) {
LAB_002d0d64:
    pArgs->options = uVar7 & 0xffffffef;
    cnv->options = uVar7 & 0xffffffef;
  }
  else if ((uVar7 & 0x10) != 0) {
    umtx_lock_63((UMutex *)0x0);
    paiVar11 = (pUVar3->mbcs).swapLFNLStateTable;
    umtx_unlock_63((UMutex *)0x0);
    if (paiVar11 == (int32_t (*) [256])0x0) {
      pUVar5 = cnv->sharedData;
      puVar6 = (pUVar5->mbcs).fromUnicodeTable;
      __src = (pUVar5->mbcs).fromUnicodeBytes;
      uVar2 = (pUVar5->mbcs).outputType;
      if ((((uVar2 == '\f') || (uVar2 == '\0')) &&
          (paiVar11 = (pUVar5->mbcs).stateTable, (*paiVar11)[0x25] == -0x7ffffff6)) &&
         ((*paiVar11)[0x15] == -0x7fffff7b)) {
        uVar10 = (ulong)*puVar6;
        if (uVar2 == '\0') {
          if ((*(short *)(__src + (ulong)puVar6[uVar10] * 2 + 0x14) == 0xf25) &&
             (*(short *)(__src + (ulong)puVar6[uVar10 + 8] * 2 + 10) == 0xf15)) goto LAB_002d0f46;
        }
        else if ((((*(uint *)(puVar6 + uVar10 * 2) >> 0x1a & 1) != 0) &&
                 ((*(short *)(__src + (ulong)((*(uint *)(puVar6 + uVar10 * 2) & 0xffff) << 5) + 0x14
                             ) == 0x25 && ((*(uint *)(puVar6 + uVar10 * 2 + 0x10) >> 0x15 & 1) != 0)
                  ))) && (*(short *)(__src + (ulong)((*(uint *)(puVar6 + uVar10 * 2 + 0x10) & 0xffff
                                                     ) << 5) + 10) == 0x15)) {
LAB_002d0f46:
          uVar7 = (pUVar5->mbcs).fromUBytesLength;
          uVar10 = (ulong)uVar7;
          if (uVar10 == 0) {
            *pErrorCode = U_INVALID_FORMAT_ERROR;
            return;
          }
          paiVar11 = (int32_t (*) [256])
                     uprv_malloc_63((ulong)(uVar7 + (uint)(pUVar5->mbcs).countStates * 0x400 + 0x50)
                                   );
          if (paiVar11 == (int32_t (*) [256])0x0) {
            *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return;
          }
          uVar12 = (ulong)(pUVar5->mbcs).countStates;
          memcpy(paiVar11,(pUVar5->mbcs).stateTable,uVar12 * 0x400);
          (*paiVar11)[0x25] = -0x7fffff7b;
          (*paiVar11)[0x15] = -0x7ffffff6;
          __dest = paiVar11 + uVar12;
          memcpy(__dest,__src,uVar10);
          uVar12 = (ulong)*puVar6;
          if ((pUVar5->mbcs).outputType == '\0') {
            *(undefined2 *)((long)*__dest + (ulong)puVar6[uVar12] * 2 + 0x14) = 0xf15;
            *(undefined2 *)((long)*__dest + (ulong)puVar6[uVar12 + 8] * 2 + 10) = 0xf25;
          }
          else {
            *(undefined2 *)
             ((long)*__dest + (ulong)((*(uint *)(puVar6 + uVar12 * 2) & 0xffff) << 5) + 0x14) = 0x15
            ;
            *(undefined2 *)
             ((long)*__dest + (ulong)((*(uint *)(puVar6 + uVar12 * 2 + 0x10) & 0xffff) << 5) + 10) =
                 0x25;
          }
          pcVar9 = (char *)((long)*__dest + uVar10);
          strcpy(pcVar9,pUVar5->staticData->name);
          sVar13 = strlen(pcVar9);
          builtin_strncpy(pcVar9 + sVar13,",swaplfnl",10);
          umtx_lock_63((UMutex *)0x0);
          if ((pUVar5->mbcs).swapLFNLStateTable == (int32_t (*) [256])0x0) {
            (pUVar5->mbcs).swapLFNLStateTable = paiVar11;
            (pUVar5->mbcs).swapLFNLFromUnicodeBytes = (uint8_t *)__dest;
            (pUVar5->mbcs).swapLFNLName = pcVar9;
            umtx_unlock_63((UMutex *)0x0);
          }
          else {
            umtx_unlock_63((UMutex *)0x0);
            uprv_free_63(paiVar11);
          }
          goto LAB_002d0d92;
        }
      }
      if (U_ZERO_ERROR < *pErrorCode) {
        return;
      }
      uVar7 = pArgs->options;
      goto LAB_002d0d64;
    }
  }
LAB_002d0d92:
  pcVar9 = pArgs->name;
  pcVar8 = strstr(pcVar9,"18030");
  if (pcVar8 == (char *)0x0) {
    pcVar8 = strstr(pcVar9,"KEIS");
    uVar7 = 0x1000;
    if ((pcVar8 == (char *)0x0) && (pcVar8 = strstr(pcVar9,"keis"), pcVar8 == (char *)0x0)) {
      pcVar8 = strstr(pcVar9,"JEF");
      uVar7 = 0x2000;
      if ((pcVar8 == (char *)0x0) && (pcVar8 = strstr(pcVar9,"jef"), pcVar8 == (char *)0x0)) {
        pcVar8 = strstr(pcVar9,"JIPS");
        uVar7 = 0x4000;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "jips";
          goto LAB_002d0dcf;
        }
      }
    }
  }
  else {
    pcVar8 = strstr(pcVar9,"gb18030");
    uVar7 = 0x8000;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "GB18030";
      uVar7 = 0x8000;
LAB_002d0dcf:
      pcVar9 = strstr(pcVar9,pcVar8);
      if (pcVar9 == (char *)0x0) goto LAB_002d0e5c;
    }
  }
  cnv->options = cnv->options | uVar7;
LAB_002d0e5c:
  if (uVar1 == '\f') {
    cnv->maxBytesPerUChar = '\x03';
  }
  piVar4 = (pUVar3->mbcs).extIndexes;
  if ((piVar4 != (int32_t *)0x0) &&
     (cVar14 = (uVar1 == '\f') + (char)piVar4[0x11], cnv->maxBytesPerUChar < cVar14)) {
    cnv->maxBytesPerUChar = cVar14;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSOpen(UConverter *cnv,
              UConverterLoadArgs *pArgs,
              UErrorCode *pErrorCode) {
    UConverterMBCSTable *mbcsTable;
    const int32_t *extIndexes;
    uint8_t outputType;
    int8_t maxBytesPerUChar;

    if(pArgs->onlyTestIsLoadable) {
        return;
    }

    mbcsTable=&cnv->sharedData->mbcs;
    outputType=mbcsTable->outputType;

    if(outputType==MBCS_OUTPUT_DBCS_ONLY) {
        /* the swaplfnl option does not apply, remove it */
        cnv->options=pArgs->options&=~UCNV_OPTION_SWAP_LFNL;
    }

    if((pArgs->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        /* do this because double-checked locking is broken */
        UBool isCached;

        umtx_lock(NULL);
        isCached=mbcsTable->swapLFNLStateTable!=NULL;
        umtx_unlock(NULL);

        if(!isCached) {
            if(!_EBCDICSwapLFNL(cnv->sharedData, pErrorCode)) {
                if(U_FAILURE(*pErrorCode)) {
                    return; /* something went wrong */
                }

                /* the option does not apply, remove it */
                cnv->options=pArgs->options&=~UCNV_OPTION_SWAP_LFNL;
            }
        }
    }

    if(uprv_strstr(pArgs->name, "18030")!=NULL) {
        if(uprv_strstr(pArgs->name, "gb18030")!=NULL || uprv_strstr(pArgs->name, "GB18030")!=NULL) {
            /* set a flag for GB 18030 mode, which changes the callback behavior */
            cnv->options|=_MBCS_OPTION_GB18030;
        }
    } else if((uprv_strstr(pArgs->name, "KEIS")!=NULL) || (uprv_strstr(pArgs->name, "keis")!=NULL)) {
        /* set a flag for KEIS converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_KEIS;
    } else if((uprv_strstr(pArgs->name, "JEF")!=NULL) || (uprv_strstr(pArgs->name, "jef")!=NULL)) {
        /* set a flag for JEF converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_JEF;
    } else if((uprv_strstr(pArgs->name, "JIPS")!=NULL) || (uprv_strstr(pArgs->name, "jips")!=NULL)) {
        /* set a flag for JIPS converter, which changes the SI/SO character sequence */
        cnv->options|=_MBCS_OPTION_JIPS;
    }

    /* fix maxBytesPerUChar depending on outputType and options etc. */
    if(outputType==MBCS_OUTPUT_2_SISO) {
        cnv->maxBytesPerUChar=3; /* SO+DBCS */
    }

    extIndexes=mbcsTable->extIndexes;
    if(extIndexes!=NULL) {
        maxBytesPerUChar=(int8_t)UCNV_GET_MAX_BYTES_PER_UCHAR(extIndexes);
        if(outputType==MBCS_OUTPUT_2_SISO) {
            ++maxBytesPerUChar; /* SO + multiple DBCS */
        }

        if(maxBytesPerUChar>cnv->maxBytesPerUChar) {
            cnv->maxBytesPerUChar=maxBytesPerUChar;
        }
    }

#if 0
    /*
     * documentation of UConverter fields used for status
     * all of these fields are (re)set to 0 by ucnv_bld.c and ucnv_reset()
     */

    /* toUnicode */
    cnv->toUnicodeStatus=0;     /* offset */
    cnv->mode=0;                /* state */
    cnv->toULength=0;           /* byteIndex */

    /* fromUnicode */
    cnv->fromUChar32=0;
    cnv->fromUnicodeStatus=1;   /* prevLength */
#endif
}